

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Select *p;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  i64 iVar10;
  char *pcVar11;
  Table *pTVar12;
  Table *pTVar13;
  RenameToken **ppRVar14;
  FKey *pFVar15;
  RenameToken *pToken_1;
  RenameToken **ppRVar16;
  RenameToken *pRVar17;
  RenameToken *pToken_3;
  Index *pIVar18;
  long lVar19;
  RenameToken *pRVar20;
  RenameToken *pRVar21;
  long lVar22;
  RenameToken *pToken_2;
  RenameToken *pRVar23;
  uint uVar24;
  TriggerStep *pTVar25;
  sqlite3 *db;
  bool bVar26;
  bool bVar27;
  RenameCtx sCtx;
  Walker sWalker;
  Parse sParse;
  RenameCtx local_268;
  sqlite3_context *local_248;
  sqlite3 *local_240;
  i64 local_238;
  char *local_230;
  Walker local_228;
  long local_1f8;
  sqlite3_value **local_1f0;
  sqlite3_xauth local_1e8;
  i64 local_1e0;
  char *local_1d8;
  Parse local_1d0;
  
  db = context->pOut->db;
  local_248 = context;
  pcVar7 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar8 = (char *)sqlite3ValueText(argv[3],'\x01');
  pcVar9 = (char *)sqlite3ValueText(argv[4],'\x01');
  iVar10 = sqlite3VdbeIntValue(argv[5]);
  pcVar11 = (char *)sqlite3ValueText(argv[6],'\x01');
  local_1e0 = sqlite3VdbeIntValue(argv[7]);
  local_238 = sqlite3VdbeIntValue(argv[8]);
  uVar24 = (uint)iVar10;
  if (((int)uVar24 < 0 || pcVar11 == (char *)0x0) ||
      (pcVar9 == (char *)0x0 || pcVar7 == (char *)0x0)) {
    return;
  }
  local_1e8 = db->xAuth;
  local_230 = pcVar7;
  local_1d8 = pcVar11;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pTVar12 = sqlite3FindTable(db,pcVar9,pcVar8);
  if ((pTVar12 == (Table *)0x0) || ((int)pTVar12->nCol <= (int)uVar24)) goto LAB_001bf092;
  local_1f8 = (ulong)(uVar24 & 0x7fffffff) * 0x20;
  pcVar7 = pTVar12->aCol[uVar24 & 0x7fffffff].zName;
  local_268.pTab = (Table *)0x0;
  local_268.zOld = (char *)0x0;
  local_268.pList = (RenameToken *)0x0;
  uVar5 = 0xffffffff;
  if (uVar24 != (int)pTVar12->iPKey) {
    uVar5 = uVar24;
  }
  local_268._8_8_ = (ulong)uVar5 << 0x20;
  db->xAuth = (sqlite3_xauth)0x0;
  local_240 = db;
  local_1f0 = argv;
  iVar6 = renameParseSql(&local_1d0,pcVar8,0,db,local_230,(int)local_238);
  local_228.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_228.walkerDepth = 0;
  local_228.eCode = '\0';
  local_228._37_3_ = 0;
  local_228.pParse = &local_1d0;
  local_228.xExprCallback = renameColumnExprCb;
  local_228.xSelectCallback = renameColumnSelectCb;
  local_268.pTab = pTVar12;
  local_228.u.pNC = (NameContext *)&local_268;
  if (iVar6 == 0) {
    if (local_1d0.pNewTable == (Table *)0x0) {
      if (local_1d0.pNewIndex == (Index *)0x0) {
        pcVar9 = (char *)0x0;
        if ((int)local_238 == 0) {
          pcVar9 = pcVar8;
        }
        iVar6 = renameResolveTrigger(&local_1d0,pcVar9);
        if (iVar6 != 0) goto LAB_001bf014;
        pTVar25 = (local_1d0.pNewTrigger)->step_list;
        if (pTVar25 != (TriggerStep *)0x0) {
          do {
            if ((pTVar25->zTarget != (char *)0x0) &&
               (pTVar13 = sqlite3LocateTable(&local_1d0,0,pTVar25->zTarget,pcVar8),
               pTVar13 == pTVar12)) {
              if (pTVar25->pUpsert != (Upsert *)0x0) {
                renameColumnElistNames(&local_1d0,&local_268,pTVar25->pUpsert->pUpsertSet,pcVar7);
              }
              renameColumnIdlistNames(&local_1d0,&local_268,pTVar25->pIdList,pcVar7);
              renameColumnElistNames(&local_1d0,&local_268,pTVar25->pExprList,pcVar7);
            }
            pTVar25 = pTVar25->pNext;
          } while (pTVar25 != (TriggerStep *)0x0);
        }
        if (local_1d0.pTriggerTab == pTVar12) {
          renameColumnIdlistNames(&local_1d0,&local_268,(local_1d0.pNewTrigger)->pColumns,pcVar7);
        }
        renameWalkTrigger(&local_228,local_1d0.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_228,(local_1d0.pNewIndex)->aColExpr);
        if ((local_1d0.pNewIndex)->pPartIdxWhere != (Expr *)0x0) {
          walkExpr(&local_228,(local_1d0.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else {
      p = (local_1d0.pNewTable)->pSelect;
      if (p == (Select *)0x0) {
        if ((local_1d0.pNewTable)->zName != (char *)0x0) {
          lVar22 = 0;
          do {
            bVar1 = pcVar9[lVar22];
            bVar2 = (local_1d0.pNewTable)->zName[lVar22];
            bVar26 = bVar1 == bVar2;
            if (bVar26) {
              if ((ulong)bVar1 == 0) goto LAB_001bed31;
            }
            else if (""[bVar1] != ""[bVar2]) goto LAB_001bed31;
            lVar22 = lVar22 + 1;
          } while( true );
        }
        bVar26 = false;
LAB_001bed31:
        local_268.pTab = local_1d0.pNewTable;
        if (bVar26) {
          ppRVar14 = &local_1d0.pRename;
          if (local_1d0.pRename != (RenameToken *)0x0) {
            pvVar4 = *(void **)((long)&(local_1d0.pNewTable)->aCol->zName + local_1f8);
            ppRVar16 = ppRVar14;
            pRVar17 = local_1d0.pRename;
            if ((local_1d0.pRename)->p != pvVar4) {
              do {
                pRVar21 = pRVar17;
                pRVar17 = pRVar21->pNext;
                if (pRVar17 == (RenameToken *)0x0) goto LAB_001bed97;
              } while (pRVar17->p != pvVar4);
              ppRVar16 = &pRVar21->pNext;
            }
            *ppRVar16 = pRVar17->pNext;
            pRVar17->pNext = local_268.pList;
            local_268.nList = local_268.nList + 1;
            local_268.pList = pRVar17;
          }
LAB_001bed97:
          if (((long)local_268._8_8_ < 0) && (local_1d0.pRename != (RenameToken *)0x0)) {
            pRVar17 = local_1d0.pRename;
            if ((i16 *)(local_1d0.pRename)->p != &(local_1d0.pNewTable)->iPKey) {
              do {
                pRVar21 = pRVar17;
                pRVar17 = pRVar21->pNext;
                if (pRVar17 == (RenameToken *)0x0) goto LAB_001bedea;
              } while ((i16 *)pRVar17->p != &(local_1d0.pNewTable)->iPKey);
              ppRVar14 = &pRVar21->pNext;
            }
            *ppRVar14 = pRVar17->pNext;
            pRVar17->pNext = local_268.pList;
            local_268.nList = local_268.nList + 1;
            local_268.pList = pRVar17;
          }
LAB_001bedea:
          sqlite3WalkExprList(&local_228,(local_1d0.pNewTable)->pCheck);
          pIVar18 = (local_1d0.pNewTable)->pIndex;
          if (pIVar18 != (Index *)0x0) {
            do {
              sqlite3WalkExprList(&local_228,pIVar18->aColExpr);
              pIVar18 = pIVar18->pNext;
            } while (pIVar18 != (Index *)0x0);
          }
          if (local_1d0.pNewIndex != (Index *)0x0) {
            pIVar18 = local_1d0.pNewIndex;
            do {
              sqlite3WalkExprList(&local_228,pIVar18->aColExpr);
              pIVar18 = pIVar18->pNext;
            } while (pIVar18 != (Index *)0x0);
          }
        }
        pFVar15 = (local_1d0.pNewTable)->pFKey;
        if (pFVar15 != (FKey *)0x0) {
          pRVar17 = local_268.pList;
          iVar6 = local_268.nList;
          do {
            iVar3 = pFVar15->nCol;
            if (0 < (long)iVar3) {
              lVar22 = 0;
              pRVar21 = pRVar17;
              do {
                pRVar17 = pRVar21;
                if ((bVar26) &&
                   (local_1d0.pRename != (RenameToken *)0x0 && pFVar15->aCol[lVar22].iFrom == uVar24
                   )) {
                  ppRVar14 = &local_1d0.pRename;
                  pRVar20 = local_1d0.pRename;
                  pRVar17 = local_1d0.pRename;
                  if ((sColMap *)(local_1d0.pRename)->p != pFVar15->aCol + lVar22) {
                    do {
                      pRVar23 = pRVar20;
                      pRVar20 = pRVar23->pNext;
                      pRVar17 = pRVar21;
                      if (pRVar20 == (RenameToken *)0x0) goto LAB_001beef5;
                    } while ((sColMap *)pRVar20->p != pFVar15->aCol + lVar22);
                    ppRVar14 = &pRVar23->pNext;
                    pRVar17 = pRVar20;
                  }
                  *ppRVar14 = pRVar17->pNext;
                  pRVar17->pNext = pRVar21;
                  iVar6 = iVar6 + 1;
                  local_268.nList = iVar6;
                  local_268.pList = pRVar17;
                }
LAB_001beef5:
                if (pFVar15->zTo != (char *)0x0) {
                  lVar19 = 0;
                  do {
                    bVar1 = pFVar15->zTo[lVar19];
                    if (bVar1 == pcVar9[lVar19]) {
                      if ((ulong)bVar1 == 0) goto LAB_001bef31;
                    }
                    else if (""[bVar1] != ""[(byte)pcVar9[lVar19]]) goto LAB_001befcb;
                    lVar19 = lVar19 + 1;
                  } while( true );
                }
                if (pcVar9 == (char *)0x0) {
LAB_001bef31:
                  pcVar8 = pFVar15->aCol[lVar22].zCol;
                  bVar27 = pcVar8 != (char *)0x0 || pcVar7 != (char *)0x0;
                  if ((pcVar8 != (char *)0x0) && (pcVar7 != (char *)0x0)) {
                    lVar19 = 0;
                    do {
                      bVar1 = pcVar8[lVar19];
                      bVar2 = pcVar7[lVar19];
                      bVar27 = bVar1 != bVar2;
                      if (bVar1 == bVar2) {
                        if ((ulong)bVar1 == 0) break;
                      }
                      else if (""[bVar1] != ""[bVar2]) break;
                      lVar19 = lVar19 + 1;
                    } while( true );
                  }
                  if (local_1d0.pRename != (RenameToken *)0x0 && !bVar27) {
                    ppRVar14 = &local_1d0.pRename;
                    pRVar21 = local_1d0.pRename;
                    if ((char *)(local_1d0.pRename)->p != pcVar8) {
                      do {
                        pRVar20 = pRVar21;
                        pRVar21 = pRVar20->pNext;
                        if (pRVar21 == (RenameToken *)0x0) goto LAB_001befcb;
                      } while ((char *)pRVar21->p != pcVar8);
                      ppRVar14 = &pRVar20->pNext;
                    }
                    *ppRVar14 = pRVar21->pNext;
                    pRVar21->pNext = pRVar17;
                    iVar6 = iVar6 + 1;
                    local_268.nList = iVar6;
                    pRVar17 = pRVar21;
                    local_268.pList = pRVar21;
                  }
                }
LAB_001befcb:
                lVar22 = lVar22 + 1;
                pRVar21 = pRVar17;
              } while (lVar22 != iVar3);
            }
            pFVar15 = pFVar15->pNextFrom;
          } while (pFVar15 != (FKey *)0x0);
        }
LAB_001befe4:
        iVar6 = 0;
        bVar26 = true;
      }
      else {
        local_1d0.rc = 0;
        bVar26 = false;
        sqlite3SelectPrep(&local_1d0,p,(NameContext *)0x0);
        iVar6 = 7;
        if (local_240->mallocFailed == '\0') {
          iVar6 = local_1d0.rc;
        }
        if (iVar6 == 0) {
          sqlite3WalkSelect(&local_228,p);
          goto LAB_001befe4;
        }
      }
      if (!bVar26) goto LAB_001bf014;
    }
    iVar6 = renameEditSql(local_248,&local_268,local_230,local_1d8,(int)local_1e0);
  }
LAB_001bf014:
  db = local_240;
  if (iVar6 != 0) {
    if (local_1d0.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(local_248,iVar6);
    }
    else {
      renameColumnParseError(local_248,0,local_1f0[1],local_1f0[2],&local_1d0);
    }
  }
  renameParseCleanup(&local_1d0);
  pRVar17 = local_268.pList;
  while (pRVar17 != (RenameToken *)0x0) {
    pRVar21 = pRVar17->pNext;
    sqlite3DbFreeNN(db,pRVar17);
    pRVar17 = pRVar21;
  }
  db->xAuth = local_1e8;
LAB_001bf092:
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, 0, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    Select *pSelect = sParse.pNewTable->pSelect;
    if( pSelect ){
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else{
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      assert( sParse.pNewTable->pSelect==0 );
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        renameTokenFind(
            &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zName
        );
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
        for(pIdx=sParse.pNewIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
      }

      for(pFKey=sParse.pNewTable->pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse, (bTemp ? 0 : zDb));
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){ 
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( sParse.zErrMsg ){
      renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}